

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

double s2pred::GetSin2Distance(S2Point *x,S2Point *y,double *error)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_28;
  double dStack_20;
  double local_18;
  
  dVar4 = x->c_[1] - y->c_[1];
  dVar5 = x->c_[2] - y->c_[2];
  dVar6 = x->c_[1] + y->c_[1];
  dVar1 = x->c_[0] - y->c_[0];
  dVar2 = y->c_[2] + x->c_[2];
  dVar3 = y->c_[0] + x->c_[0];
  local_28 = dVar4 * dVar2 - dVar5 * dVar6;
  dStack_20 = dVar5 * dVar3 - dVar1 * dVar2;
  local_18 = dVar1 * dVar6 - dVar3 * dVar4;
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_28);
  dVar1 = dVar1 * 0.25;
  if (dVar1 < 0.0) {
    dVar2 = sqrt(dVar1);
  }
  else {
    dVar2 = SQRT(dVar1);
  }
  *error = dVar1 * 3.100653426266254e-15 + dVar2 * 6.831735839737845e-31 + 1.166815364598964e-61;
  return dVar1;
}

Assistant:

inline double GetSin2Distance(const S2Point& x, const S2Point& y,
                              double* error) {
  // The (x-y).CrossProd(x+y) trick eliminates almost all of error due to "x"
  // and "y" being not quite unit length.  This method is extremely accurate
  // for small distances; the *relative* error in the result is O(DBL_ERR) for
  // distances as small as DBL_ERR.
  S2Point n = (x - y).CrossProd(x + y);
  double d2 = 0.25 * n.Norm2();
  *error = ((21 + 4 * sqrt(3)) * DBL_ERR * d2 +
            32 * sqrt(3) * DBL_ERR * DBL_ERR * sqrt(d2) +
            768 * DBL_ERR * DBL_ERR * DBL_ERR * DBL_ERR);
  return d2;
}